

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  mapped_type *filename;
  mapped_type *references_00;
  string *uniqueSupportFilter_00;
  mapped_type *this;
  string *psVar10;
  long lVar11;
  char *pcVar12;
  istream *piVar13;
  mapped_type *pmVar14;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *pdVar15;
  long *plVar16;
  void *pvVar17;
  size_type sVar18;
  size_type sVar19;
  reference pbVar20;
  mapped_type *pmVar21;
  reference ppAVar22;
  clock_t cVar23;
  CliqueCollector *this_00;
  double dVar24;
  __type _Var25;
  __type _Var26;
  __type _Var27;
  __type _Var28;
  double cpu_time;
  AlignmentRecord **r;
  iterator __end1_1;
  iterator __begin1_1;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range1_1;
  ofstream os3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  int chroma2;
  int chroma1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consistingReads_1;
  iterator it_2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  errorReadsUniqueSupportMap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> errorReadsSupportMap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  trueReadsUniqueSupportMap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> trueReadsSupportMap;
  int trueWithNoUnique;
  int errorWithNoUnique;
  int totalCount;
  int errorCount;
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consistingReads;
  iterator it_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  readCountMap;
  ofstream osSupportTrue;
  ofstream osSupportError;
  ofstream osUniqueTrue;
  ofstream osUniqueError;
  ofstream os;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> it;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> new_end_it;
  anon_class_8_1_552cbcb6_for__M_pred filter_fn_1;
  unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> al_ptr;
  int size;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  appearanceMap;
  int numAllowedGCPos;
  int prevReadsSize;
  int nonEdgeCounter;
  int edgecounter;
  anon_class_32_4_0a7c01a2 filter_fn;
  double stdev;
  int ct;
  ofstream *reads_ofstream;
  CliqueFinder *clique_finder;
  CliqueCollector collector;
  LogWriter *lw;
  ofstream *indel_os;
  double insert_stddev;
  double insert_mean;
  unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  readgroup_params;
  EdgeCalculator *indel_edge_calculator;
  EdgeCalculator *edge_calculator;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads;
  RefVector references;
  SamHeader header;
  uint maxPosition1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  originalReadNames;
  clock_t clock_start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string ia_line;
  ifstream ia;
  uint maxPosition2;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  simpson_map;
  bool call_indels;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateRS;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateFS;
  string reference_path;
  double minOverlap;
  double uniqueSupportFilter;
  double nomeParam;
  bool nome;
  bool analysisFiles;
  bool bam;
  bool noProb0;
  int doc_haplotypes;
  string logfile;
  bool filter_singletons;
  double significance;
  double filter;
  int iterations;
  string indel_output_file;
  double indel_edge_sig_level;
  string indel_edge_cutoff;
  string mean_and_sd_filename;
  string allel_frequencies_path;
  bool frameshift_merge;
  double overlap_single;
  double overlap_cliques;
  double Q;
  double edge_quasi_cutoff_mixed;
  double edge_quasi_cutoff_single;
  double edge_quasi_cutoff_cliques;
  string outfile;
  string bamfile;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
  elem;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  args;
  undefined4 in_stack_ffffffffffffd898;
  int in_stack_ffffffffffffd89c;
  AlignmentRecord *in_stack_ffffffffffffd8a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
  *in_stack_ffffffffffffd8a8;
  CLEVER *in_stack_ffffffffffffd8b0;
  unary_negate<std::pointer_to_unary_function<int,_int>_> in_stack_ffffffffffffd8b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd8c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd8c8;
  LogWriter *in_stack_ffffffffffffd8d0;
  unary_negate<std::pointer_to_unary_function<int,_int>_> in_stack_ffffffffffffd8d8;
  NoMeEdgeCalculator *in_stack_ffffffffffffd8e0;
  AlignmentRecord *pAVar29;
  undefined8 in_stack_ffffffffffffd8e8;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *in_stack_ffffffffffffd8f0;
  const_iterator *in_stack_ffffffffffffd8f8;
  string *psVar30;
  const_iterator *in_stack_ffffffffffffd900;
  anon_class_8_1_552cbcb6_for__M_pred in_stack_ffffffffffffd908;
  is_any_ofF<char> *in_stack_ffffffffffffd910;
  undefined1 frameshift_merge_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd918;
  undefined4 in_stack_ffffffffffffd920;
  undefined4 in_stack_ffffffffffffd924;
  double in_stack_ffffffffffffd928;
  NewEdgeCalculator *in_stack_ffffffffffffd930;
  string *in_stack_ffffffffffffd938;
  undefined4 in_stack_ffffffffffffd950;
  int in_stack_ffffffffffffd954;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *in_stack_ffffffffffffd958;
  ostream *in_stack_ffffffffffffd960;
  uint local_2484;
  string *in_stack_ffffffffffffdbc8;
  allocator *paVar31;
  string *in_stack_ffffffffffffdc28;
  mapped_type *in_stack_ffffffffffffdc30;
  allocator *header_00;
  undefined7 in_stack_ffffffffffffdcb8;
  undefined7 in_stack_ffffffffffffdce8;
  allocator *references_01;
  string *in_stack_ffffffffffffdda8;
  mapped_type *in_stack_ffffffffffffddb0;
  allocator *in_stack_ffffffffffffddb8;
  undefined7 in_stack_ffffffffffffddc0;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_20f8;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *local_20d8;
  string local_20d0 [32];
  undefined1 local_20b0 [512];
  string local_1eb0 [32];
  string local_1e90 [32];
  string local_1e70 [32];
  string local_1e50 [32];
  string local_1e30 [32];
  string local_1e10 [32];
  string local_1df0 [32];
  string local_1dd0 [32];
  string local_1db0 [64];
  _Self local_1d70;
  _Self local_1d68;
  _Self local_1d60;
  _Self local_1d58;
  _Self local_1d50;
  _Self local_1d48;
  _Self local_1d40;
  _Self local_1d38;
  string local_1d30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d08;
  undefined1 *local_1d00;
  int local_1cf8;
  int local_1cf4;
  undefined1 local_1cf0 [56];
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_1cb8 [7];
  int local_1bd8;
  int local_1bd4;
  int local_1bd0;
  int local_1bcc;
  _Self local_1ba8;
  _Self local_1ba0;
  undefined8 local_1b98;
  undefined8 local_1b90;
  undefined8 local_1b88;
  _func_int_int *local_1b80;
  pointer_to_unary_function<int,_int> local_1b78;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b60;
  char *local_1b58;
  undefined8 local_1b50;
  undefined8 local_1b48;
  _func_int_int *local_1b40;
  pointer_to_unary_function<int,_int> local_1b38;
  undefined8 local_1b30;
  undefined8 local_1b28;
  char *local_1b20;
  undefined8 local_1b18;
  undefined8 local_1b10;
  undefined8 local_1b08;
  string local_1b00 [32];
  string local_1ae0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ac0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1ab8;
  undefined1 *local_1ab0;
  undefined1 local_1aa8 [56];
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_1a70 [2];
  string local_1a20 [32];
  string local_1a00 [32];
  undefined1 local_19e0 [512];
  string local_17e0 [32];
  string local_17c0 [32];
  undefined1 local_17a0 [512];
  string local_15a0 [32];
  string local_1580 [32];
  undefined1 local_1560 [512];
  string local_1360 [32];
  string local_1340 [32];
  undefined1 local_1320 [512];
  string local_1120 [32];
  undefined1 local_1100 [544];
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_ee0;
  _Deque_iterator<AlignmentRecord*,AlignmentRecord*const&,AlignmentRecord*const*> local_ec0 [32];
  _Deque_iterator<AlignmentRecord*,AlignmentRecord*const&,AlignmentRecord*const*> local_ea0 [96];
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_e40;
  double *local_e20;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_dd8;
  double *local_db8;
  undefined1 local_db0 [12];
  undefined4 local_da4;
  undefined1 local_da0 [48];
  int local_d70;
  undefined4 local_d6c;
  int local_d68;
  int local_d64;
  int *local_d60;
  undefined1 *local_d58;
  undefined8 *local_d50;
  double *local_d48;
  double local_d40;
  int local_d34;
  CLEVER *local_d30;
  long *local_d28;
  undefined1 local_cf9;
  string local_cf8 [32];
  long *local_cd8;
  long *local_cd0;
  double local_cc8;
  double local_cc0;
  undefined1 local_cb1;
  void *local_c38;
  long *local_c30;
  string local_c28 [32];
  string local_c08 [32];
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *local_be8;
  allocator local_bc1;
  string local_bc0 [32];
  SamHeader local_ba0 [348];
  uint local_a44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a40;
  clock_t local_a28;
  int local_a1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a00 [2];
  locale local_9d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c8;
  string local_9b0 [32];
  istream local_990 [524];
  uint local_784;
  undefined4 local_748;
  byte local_742;
  allocator local_741;
  string local_740 [32];
  string local_720 [95];
  allocator local_6c1;
  string local_6c0 [32];
  string local_6a0 [95];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [32];
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [32];
  double local_5b0;
  allocator local_5a1;
  string local_5a0 [32];
  double local_580;
  allocator local_571;
  string local_570 [32];
  double local_550;
  allocator local_541;
  string local_540 [38];
  byte local_51a;
  allocator local_519;
  string local_518 [38];
  byte local_4f2;
  undefined1 local_4f1 [38];
  byte local_4cb;
  undefined1 local_4ca;
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [32];
  int local_480;
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  undefined1 local_3d9;
  undefined8 local_3d8;
  double local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  int local_3a0;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  undefined8 local_328;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [40];
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  string local_118 [72];
  _Self local_d0;
  _Self local_c8;
  undefined1 *local_c0;
  string local_b8 [87];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [60];
  int local_4;
  
  local_4 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,"in main");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,
             "ChromaClique predicts nucleosome patterns NOMe-sequencing reads.\n\nUsage:\n  chromaclique [options] [--] <bamfile> [<output>]\nOptions:\n  -i NUM --iterations=NUM                  Number of iterations.\n                                           chromaclique will stop if the\n                                           superreads converge.\n                                           [default: -1]\n  -n --no_singletons                       Filter out single read cliques\n                                           after first iteration.\n  -L FILE --log=FILE                       Write log to <file>.\n  -bam --bam                               Option to create BAM File from output. <output> is used as prefix.\n  -nome --nome                             Option for NoMe Mode\n  -nP NUM --nomeParam=NUM                  Number of similar GC regions required for merging reads\n  -minOv NUM --minOverlap=NUM              minimum number of GC allowed in the overlapping regions\n  -R FILE --ref=FILE                       Reference File\n  -R FILE --FS=FILE                        Switch rates for the Forward strand\n  -R FILE --RS=FILE                        Switch rates for the Reverse strand\n  -unique NUM --uniqueSupportFilter=NUM    Filtering based on the specified number of unique support for each clique\n  -analysisFiles --analysisFiles           Option For creating analysis Files\n\n\n"
             ,&local_61);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x223bd6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd8e0,(char **)in_stack_ffffffffffffd8d8._M_pred._M_ptr,
             (char **)in_stack_ffffffffffffd8d0,
             (allocator_type *)in_stack_ffffffffffffd8c8._M_current);
  std::__cxx11::string::string(local_b8);
  docopt::docopt(in_stack_ffffffffffffd938,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd930,SUB81((ulong)in_stack_ffffffffffffd928 >> 0x38,0),
                 (string *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                 SUB81((ulong)in_stack_ffffffffffffd918 >> 0x38,0));
  std::__cxx11::string::~string(local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd8b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x223c5c);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_c0 = local_40;
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  while (bVar1 = std::operator!=(&local_c8,&local_d0), bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>
                 *)0x223cdb);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8a8);
    poVar6 = std::operator<<((ostream *)&std::cout,local_118);
    std::operator<<(poVar6," ");
    poVar6 = docopt::operator<<((ostream *)in_stack_ffffffffffffd8e0,
                                (value *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    std::operator<<(poVar6,"\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
             *)in_stack_ffffffffffffd8a0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>
                  *)in_stack_ffffffffffffd8a0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"<bamfile>",&local_159);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  psVar7 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::string(local_138,(string *)psVar7);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"chromatypes.fasta",&local_181);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"<output>",&local_1a9);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(pmVar8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"<output>",&local_1d1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    psVar7 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_180,(string *)psVar7);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  local_1e0 = 0x3fefae147ae147ae;
  local_1e8 = 0x3fee666666666666;
  local_1f0 = 0x3fef0a3d70a3d70a;
  local_1f8 = 0x3feccccccccccccd;
  local_200 = 0x3feccccccccccccd;
  local_208 = 0x3fe3333333333333;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"",&local_231);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"--allel_frequencies",&local_259);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(pmVar8);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"--allel_frequencies",&local_281);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    psVar7 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_230,(string *)psVar7);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"",&local_2a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"--mean_and_sd_filename",&local_2d1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(pmVar8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"--mean_and_sd_filename",&local_2f9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    psVar7 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_2a8,(string *)psVar7);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  }
  std::__cxx11::string::string(local_320);
  local_328 = 0x3fc999999999999a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"",&local_349);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"--call_indels",&local_371);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar2 = docopt::value::operator_cast_to_bool(pmVar8);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  if ((bVar2 & 1) != 0) {
    in_stack_ffffffffffffddb8 = &local_399;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"--call_indels",in_stack_ffffffffffffddb8);
    in_stack_ffffffffffffddb0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                       *)in_stack_ffffffffffffd8e0,
                      (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    in_stack_ffffffffffffdda8 =
         docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_348,(string *)in_stack_ffffffffffffdda8);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
  }
  references_01 = &local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"--iterations",references_01);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  iVar5 = std::__cxx11::stoi(&in_stack_ffffffffffffd8a0->name,
                             (size_t *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898)
                             ,0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  local_3d0 = 0.0;
  local_3d8 = 0x4008000000000000;
  local_3a0 = iVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"--no_singletons",&local_401);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::asBool((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  local_3d9 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"",&local_429);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"--log",&local_451);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"--log",&local_479);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    psVar7 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_428,(string *)psVar7);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
  }
  local_480 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"--doc_haplotypes",&local_4a1);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"--doc_haplotypes",&local_4c9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    local_480 = std::__cxx11::stoi(&in_stack_ffffffffffffd8a0->name,
                                   (size_t *)
                                   CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),0);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  }
  local_4ca = 0;
  psVar7 = (string *)local_4f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_4f1 + 1),"--bam",(allocator *)psVar7);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)in_stack_ffffffffffffd8e0,
                        (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar3 = docopt::value::asBool((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::~string((string *)(local_4f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4f1);
  local_4cb = bVar3 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"--analysisFiles",&local_519);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::asBool((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  local_4f2 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"--nome",&local_541);
  filename = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                           *)in_stack_ffffffffffffd8e0,
                          (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar4 = docopt::value::asBool((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  local_51a = bVar4 & 1;
  header_00 = &local_571;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"--nomeParam",header_00);
  references_00 =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                     *)in_stack_ffffffffffffd8e0,
                    (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  uniqueSupportFilter_00 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  dVar24 = std::__cxx11::stod(&in_stack_ffffffffffffd8a0->name,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_550 = dVar24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"--uniqueSupportFilter",&local_5a1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  dVar24 = std::__cxx11::stod(&in_stack_ffffffffffffd8a0->name,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  local_580 = dVar24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d0,"--minOverlap",&local_5d1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  dVar24 = std::__cxx11::stod(&in_stack_ffffffffffffd8a0->name,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  local_5b0 = dVar24;
  std::__cxx11::string::string(local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"--ref",&local_619);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                       *)in_stack_ffffffffffffd8e0,
                      (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  bVar1 = docopt::value::operator_cast_to_bool(this);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_640,"--ref",&local_641);
    in_stack_ffffffffffffdc30 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                       *)in_stack_ffffffffffffd8e0,
                      (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
    in_stack_ffffffffffffdc28 =
         docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
    std::__cxx11::string::operator=(local_5f8,(string *)in_stack_ffffffffffffdc28);
    std::__cxx11::string::~string(local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
  }
  paVar31 = &local_6c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"--FS",paVar31);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  psVar10 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::string(local_6a0,(string *)psVar10);
  readSwitchRateFile(in_stack_ffffffffffffdbc8);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"--RS",&local_741);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                *)in_stack_ffffffffffffd8e0,(key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
  psVar10 = docopt::value::asString_abi_cxx11_((value *)in_stack_ffffffffffffd8a0);
  std::__cxx11::string::string(local_720,(string *)psVar10);
  readSwitchRateFile(in_stack_ffffffffffffdbc8);
  std::__cxx11::string::~string(local_720);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  lVar11 = std::__cxx11::string::size();
  local_742 = lVar11 != 0;
  if (((bool)local_742) && (lVar11 = std::__cxx11::string::size(), lVar11 == 0)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Error: when using option -I, option -M must also be given.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_748 = 1;
    goto LAB_00228838;
  }
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x22587a);
  local_784 = 0;
  std::ostream::flush();
  lVar11 = std::__cxx11::string::size();
  if (lVar11 != 0) {
    pcVar12 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_990,pcVar12,_S_in);
    std::__cxx11::string::string(local_9b0);
    while( true ) {
      piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_990,local_9b0);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(piVar13 + *(long *)(*(long *)piVar13 + -0x18)));
      if (!bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x225937);
      std::locale::locale(local_9d0);
      boost::algorithm::trim_right<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd8d0,(locale *)in_stack_ffffffffffffd8c8._M_current);
      std::locale::~locale(local_9d0);
      boost::algorithm::is_any_of<char[2]>((char (*) [2])in_stack_ffffffffffffd8b8._M_pred._M_ptr);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                 in_stack_ffffffffffffd918,in_stack_ffffffffffffd910,
                 (token_compress_mode_type)((ulong)in_stack_ffffffffffffd908.filter >> 0x20));
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
                ((is_any_ofF<char> *)in_stack_ffffffffffffd8a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2259c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_9c8,0);
      boost::algorithm::is_any_of<char[3]>((char (*) [3])in_stack_ffffffffffffd8b8._M_pred._M_ptr);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                 in_stack_ffffffffffffd918,in_stack_ffffffffffffd910,
                 (token_compress_mode_type)((ulong)in_stack_ffffffffffffd908.filter >> 0x20));
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
                ((is_any_ofF<char> *)in_stack_ffffffffffffd8a0);
      sVar18 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_a00);
      if (sVar18 < 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,1);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        atof(pcVar12);
        _Var25 = std::pow<double,int>((double)in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd89c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,2);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        atof(pcVar12);
        _Var26 = std::pow<double,int>((double)in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd89c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,3);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        atof(pcVar12);
        _Var27 = std::pow<double,int>((double)in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd89c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,4);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        atof(pcVar12);
        _Var28 = std::pow<double,int>((double)in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd89c);
        dVar24 = log10(_Var25 + _Var26 + _Var27 + _Var28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        local_a1c = atoi(pcVar12);
        pmVar14 = std::
                  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                *)in_stack_ffffffffffffd8a0,
                               (key_type *)
                               CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        *pmVar14 = dVar24;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_9c8,0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        local_784 = atoi(pcVar12);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd8b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd8b0);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_9b0);
    std::ifstream::~ifstream(local_990);
  }
  frameshift_merge_00 = (undefined1)((ulong)in_stack_ffffffffffffd910 >> 0x38);
  local_a28 = clock();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x225d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"",&local_bc1);
  BamTools::SamHeader::SamHeader(local_ba0,local_bc0);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)0x225de2);
  std::__cxx11::string::string(local_c08,local_138);
  std::__cxx11::string::string(local_c28,local_5f8);
  pdVar15 = readBamFile((string *)CONCAT17(bVar2,in_stack_ffffffffffffddc0),
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffddb8,&in_stack_ffffffffffffddb0->kind,
                        (SamHeader *)in_stack_ffffffffffffdda8,(RefVector *)references_01,
                        (string *)pmVar8);
  std::__cxx11::string::~string(local_c28);
  std::__cxx11::string::~string(local_c08);
  local_c30 = (long *)0x0;
  local_c38 = (void *)0x0;
  local_be8 = pdVar15;
  std::
  unique_ptr<std::vector<mean_and_stddev_t,std::allocator<mean_and_stddev_t>>,std::default_delete<std::vector<mean_and_stddev_t,std::allocator<mean_and_stddev_t>>>>
  ::
  unique_ptr<std::default_delete<std::vector<mean_and_stddev_t,std::allocator<mean_and_stddev_t>>>,void>
            ((unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
              *)in_stack_ffffffffffffd8a0,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  if (local_784 < local_a44) {
    local_2484 = local_a44;
  }
  else {
    local_2484 = local_784;
  }
  local_a44 = local_2484;
  if ((local_51a & 1) == 0) {
    plVar16 = (long *)operator_new(0x70);
    NewEdgeCalculator::NewEdgeCalculator
              (in_stack_ffffffffffffd930,in_stack_ffffffffffffd928,
               (double)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
               (double)in_stack_ffffffffffffd918,(bool)frameshift_merge_00,
               (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)in_stack_ffffffffffffd908.filter,(double)in_stack_ffffffffffffd900,
               (double)in_stack_ffffffffffffd8f8,(double)in_stack_ffffffffffffd8f0,
               (uint)((ulong)in_stack_ffffffffffffd8e8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd8e8 >> 0x18,0));
    local_c30 = plVar16;
  }
  else {
    plVar16 = (long *)operator_new(0x80);
    local_cb1 = 1;
    std::
    unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)in_stack_ffffffffffffd8a0,
                    (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    std::
    unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)in_stack_ffffffffffffd8a0,
                    (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    NoMeEdgeCalculator::NoMeEdgeCalculator
              (in_stack_ffffffffffffd8e0,(double)in_stack_ffffffffffffd8d8._M_pred._M_ptr,
               (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)in_stack_ffffffffffffd8d0,
               (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)in_stack_ffffffffffffd8c8._M_current);
    local_cb1 = 0;
    local_c30 = plVar16;
    std::
    unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)0x225f95);
    std::
    unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)0x225fa2);
  }
  if ((local_742 & 1) == 0) {
LAB_0022638c:
    local_cd0 = (long *)0x0;
    if ((local_742 & 1) != 0) {
      plVar16 = (long *)operator_new(0x200);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(plVar16,pcVar12,_S_out);
      local_cd0 = plVar16;
    }
    local_cd8 = (long *)0x0;
    bVar1 = std::operator!=(&in_stack_ffffffffffffd8a0->name,
                            (char *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    if (bVar1) {
      plVar16 = (long *)operator_new(0x290);
      local_cf9 = 1;
      std::__cxx11::string::string(local_cf8,local_428);
      LogWriter::LogWriter(in_stack_ffffffffffffd8d0,(string *)in_stack_ffffffffffffd8c8._M_current)
      ;
      local_cf9 = 0;
      local_cd8 = plVar16;
      std::__cxx11::string::~string(local_cf8);
    }
    CliqueCollector::CliqueCollector
              ((CliqueCollector *)in_stack_ffffffffffffd8c0._M_current,
               (LogWriter *)in_stack_ffffffffffffd8b8._M_pred._M_ptr);
    plVar16 = (long *)operator_new(0x90);
    CLEVER::CLEVER(in_stack_ffffffffffffd8b0,(EdgeCalculator *)in_stack_ffffffffffffd8a8,
                   (CliqueCollector *)in_stack_ffffffffffffd8a0,
                   (LogWriter *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    local_d28 = plVar16;
    if (local_c38 != (void *)0x0) {
      (**(code **)(*plVar16 + 0x30))(plVar16,local_c38);
    }
    local_d30 = (CLEVER *)0x0;
    local_d34 = 0;
    local_d40 = 1.0;
    local_d60 = &local_d34;
    local_d58 = &local_3d9;
    local_d50 = &local_3d8;
    local_d48 = &local_d40;
    local_d64 = 0;
    local_d68 = 0;
    poVar6 = std::operator<<((ostream *)&std::cout,"start: ");
    sVar18 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_a40);
    std::ostream::operator<<(poVar6,sVar18);
    local_d6c = 0;
    local_d70 = (int)local_5b0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)0x2266bd);
    while (local_d34 != local_3a0) {
      sVar19 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)0x2266de);
      if (sVar19 != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)0x2266f1);
      }
      (**(code **)(*local_d28 + 0x18))(local_d28,local_da0);
      if (local_cd8 != (long *)0x0) {
        LogWriter::initialize((LogWriter *)in_stack_ffffffffffffd8a0);
      }
      sVar18 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size
                         ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x22674e);
      local_da4 = (undefined4)sVar18;
      sVar18 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size
                         ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x226762);
      local_d6c = (undefined4)sVar18;
      while (bVar1 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::empty
                               ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                                0x226776), ((bVar1 ^ 0xffU) & 1) != 0) {
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::front
                  ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                   in_stack_ffffffffffffd8b0);
        std::unique_ptr<AlignmentRecord,std::default_delete<AlignmentRecord>>::
        unique_ptr<std::default_delete<AlignmentRecord>,void>
                  ((unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)
                   in_stack_ffffffffffffd8a0,
                   (pointer)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::pop_front
                  ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                   in_stack_ffffffffffffd8a0);
        bVar1 = main::anon_class_32_4_0a7c01a2::operator()
                          ((anon_class_32_4_0a7c01a2 *)in_stack_ffffffffffffd8b0,
                           (unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)
                           in_stack_ffffffffffffd8a8,(int)((ulong)in_stack_ffffffffffffd8a0 >> 0x20)
                          );
        if (bVar1) {
          local_748 = 8;
        }
        else {
          (**(code **)(*local_d28 + 0x10))
                    (local_d28,local_db0,&local_d64,&local_d68,local_d70,local_d34);
          local_748 = 0;
        }
        std::unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_>::~unique_ptr
                  ((unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)
                   in_stack_ffffffffffffd8a0);
      }
      if (2 < local_d70) {
        local_d70 = local_d70 + -1;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"\tedges: ");
      std::ostream::operator<<(poVar6,local_d64);
      poVar6 = std::operator<<((ostream *)&std::cout,"\tnonEdges: ");
      pvVar17 = (void *)std::ostream::operator<<(poVar6,local_d68);
      std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
      pdVar15 = local_be8;
      if (local_be8 != (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x0) {
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~deque
                  (in_stack_ffffffffffffd8f0);
        operator_delete(pdVar15);
      }
      (**(code **)(*local_d28 + 0x20))();
      local_be8 = CliqueCollector::finish
                            ((CliqueCollector *)
                             CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920));
      if (local_cd8 != (long *)0x0) {
        LogWriter::finish((LogWriter *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920)
                         );
      }
      local_d40 = setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                                   CONCAT44(in_stack_ffffffffffffd954,in_stack_ffffffffffffd950));
      bVar2 = (**(code **)(*local_d28 + 0x38))();
      iVar5 = local_d34;
      if ((bVar2 & 1) != 0) break;
      local_d34 = local_d34 + 1;
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
      poVar6 = std::operator<<(poVar6,": ");
      sVar18 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size
                         ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x226a50);
      std::ostream::operator<<(poVar6,sVar18);
      local_d64 = 0;
      local_d68 = 0;
    }
    if (0.0 < local_3d0) {
      local_db8 = &local_3d0;
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
      local_e20 = local_db8;
      std::
      remove_if<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,main::__1>
                ((_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                 in_stack_ffffffffffffd900,
                 (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                 in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd908);
      std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
      _Deque_iterator(&local_e40,&local_dd8);
      while( true ) {
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
                  ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                   CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffd8a0,
                                (_Self *)CONCAT44(in_stack_ffffffffffffd89c,
                                                  in_stack_ffffffffffffd898));
        if (!bVar1) break;
        ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                   operator*(&local_e40);
        pAVar29 = *ppAVar22;
        if (pAVar29 != (AlignmentRecord *)0x0) {
          AlignmentRecord::~AlignmentRecord(in_stack_ffffffffffffd8a0);
          operator_delete(pAVar29);
        }
        ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                   operator*(&local_e40);
        *ppAVar22 = (AlignmentRecord *)0x0;
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                   in_stack_ffffffffffffd8a8,(int)((ulong)in_stack_ffffffffffffd8a0 >> 0x20));
      }
      std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*const&,AlignmentRecord*const*>::
      _Deque_iterator<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,void>
                (local_ea0,&local_dd8);
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
      std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*const&,AlignmentRecord*const*>::
      _Deque_iterator<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,void>
                (local_ec0,&local_ee0);
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::erase
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 in_stack_ffffffffffffd908.filter,in_stack_ffffffffffffd900,
                 in_stack_ffffffffffffd8f8);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
    std::ofstream::ofstream(local_1100,local_1120,_S_out);
    std::__cxx11::string::~string(local_1120);
    setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                     CONCAT44(in_stack_ffffffffffffd954,in_stack_ffffffffffffd950));
    iVar5 = (int)((ulong)paVar31 >> 0x20);
    if (-1.0 < local_580) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
      std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
      std::ofstream::ofstream(local_1320,local_1340,_S_out);
      std::__cxx11::string::~string(local_1340);
      std::__cxx11::string::~string(local_1360);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
      std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
      std::ofstream::ofstream(local_1560,local_1580,_S_out);
      std::__cxx11::string::~string(local_1580);
      std::__cxx11::string::~string(local_15a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
      std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
      std::ofstream::ofstream(local_17a0,local_17c0,_S_out);
      std::__cxx11::string::~string(local_17c0);
      std::__cxx11::string::~string(local_17e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
      std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
      std::ofstream::ofstream(local_19e0,local_1a00,_S_out);
      std::__cxx11::string::~string(local_1a00);
      std::__cxx11::string::~string(local_1a20);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x226e97);
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
      while( true ) {
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
                  ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                   CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffd8a0,
                                (_Self *)CONCAT44(in_stack_ffffffffffffd89c,
                                                  in_stack_ffffffffffffd898));
        if (!bVar1) break;
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                  (local_1a70);
        AlignmentRecord::getConsistingReads_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898))
        ;
        local_1ab0 = local_1aa8;
        local_1ab8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        local_1ac0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffd8a0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898)),
              bVar1) {
          pbVar20 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1ab8);
          std::__cxx11::string::string(local_1ae0,(string *)pbVar20);
          lVar11 = std::__cxx11::string::find((char *)local_1ae0,0x3047fb);
          if ((lVar11 == -1) &&
             (lVar11 = std::__cxx11::string::find((char *)local_1ae0,0x3047ff), lVar11 == -1)) {
            std::__cxx11::string::string(local_1b00,local_1ae0);
            local_1b10 = std::__cxx11::string::begin();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffd8a0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b28 = std::__cxx11::string::begin();
            local_1b30 = std::__cxx11::string::end();
            local_1b40 = (_func_int_int *)
                         std::ptr_fun<int,int>
                                   ((_func_int_int *)
                                    CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b38._M_ptr =
                 (_func_int_int *)
                 std::not1<std::pointer_to_unary_function<int,int>>
                           ((pointer_to_unary_function<int,_int> *)
                            CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b20 = (char *)std::
                                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                                           (in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8c0,
                                            in_stack_ffffffffffffd8b8);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffd8a0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b48 = std::__cxx11::string::erase(local_1b00,local_1b08,local_1b18);
            std::__cxx11::string::rbegin();
            std::__cxx11::string::rend();
            local_1b80 = (_func_int_int *)
                         std::ptr_fun<int,int>
                                   ((_func_int_int *)
                                    CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b78._M_ptr =
                 (_func_int_int *)
                 std::not1<std::pointer_to_unary_function<int,int>>
                           ((pointer_to_unary_function<int,_int> *)
                            CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            std::
            find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd8d0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8d8);
            local_1b58 = (char *)std::
                                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::base(&local_1b60);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffd8a0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b90 = std::__cxx11::string::end();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffd8a0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            local_1b98 = std::__cxx11::string::erase(local_1b00,local_1b50,local_1b88);
            local_1ba0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),
                        (key_type *)0x22725c);
            local_1ba8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
            bVar1 = std::operator!=(&local_1ba0,&local_1ba8);
            if (bVar1) {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)in_stack_ffffffffffffd8e0,
                                     (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
              iVar5 = *pmVar21;
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)in_stack_ffffffffffffd8e0,
                                     (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
              *pmVar21 = iVar5 + 1;
            }
            else {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)in_stack_ffffffffffffd8e0,
                                     (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
              *pmVar21 = 1;
            }
            std::__cxx11::string::~string(local_1b00);
          }
          std::__cxx11::string::~string(local_1ae0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1ab8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd8b0);
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                   in_stack_ffffffffffffd8a8,(int)((ulong)in_stack_ffffffffffffd8a0 >> 0x20));
      }
      local_1bcc = 0;
      local_1bd0 = 0;
      local_1bd4 = 0;
      local_1bd8 = 0;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x227605);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x227612);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x22761f);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x22762c);
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
      while( true ) {
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
                  ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                   CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffd8a0,
                                (_Self *)CONCAT44(in_stack_ffffffffffffd89c,
                                                  in_stack_ffffffffffffd898));
        iVar5 = (int)((ulong)paVar31 >> 0x20);
        if (!bVar1) break;
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                  (local_1cb8);
        AlignmentRecord::getConsistingReads_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898))
        ;
        local_1cf4 = 0;
        local_1cf8 = 0;
        local_1d00 = local_1cf0;
        local_1d08._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        local_1d10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffd8a0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898)),
              bVar1) {
          pbVar20 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1d08);
          std::__cxx11::string::string(local_1d30,(string *)pbVar20);
          lVar11 = std::__cxx11::string::find((char *)local_1d30,0x3047fb);
          if ((lVar11 == -1) &&
             (lVar11 = std::__cxx11::string::find((char *)local_1d30,0x3047ff), lVar11 == -1)) {
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)in_stack_ffffffffffffd8e0,
                                   (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            if (*pmVar21 < 2) {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)in_stack_ffffffffffffd8e0,
                                     (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
              if (*pmVar21 == 1) {
                ppAVar22 = std::
                           _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                           ::operator*(local_1cb8);
                (*ppAVar22)->uniqueSupport = (*ppAVar22)->uniqueSupport + 1;
                ppAVar22 = std::
                           _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                           ::operator*(local_1cb8);
                (*ppAVar22)->support = (*ppAVar22)->support + 1;
              }
            }
            else {
              ppAVar22 = std::
                         _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                         ::operator*(local_1cb8);
              (*ppAVar22)->support = (*ppAVar22)->support + 1;
            }
            lVar11 = std::__cxx11::string::find((char *)local_1d30,0x304806);
            if (lVar11 != -1) {
              local_1cf4 = local_1cf4 + 1;
            }
            lVar11 = std::__cxx11::string::find((char *)local_1d30,0x30480e);
            if (lVar11 != -1) {
              local_1cf8 = local_1cf8 + 1;
            }
          }
          std::__cxx11::string::~string(local_1d30);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1d08);
        }
        if ((local_1cf4 == 0) || (local_1cf8 == 0)) {
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          if (((double)(*ppAVar22)->uniqueSupport == local_580) &&
             (!NAN((double)(*ppAVar22)->uniqueSupport) && !NAN(local_580))) {
            local_1bd8 = local_1bd8 + 1;
          }
          std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                    (local_1cb8);
          local_1d58._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),
                          (key_type *)0x227c9d);
          local_1d60._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
          bVar1 = std::operator!=(&local_1d58,&local_1d60);
          if (bVar1) {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            in_stack_ffffffffffffd960 =
                 (ostream *)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_ffffffffffffd8e0,
                            (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            in_stack_ffffffffffffd954 = *(int *)in_stack_ffffffffffffd960 + 1;
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            in_stack_ffffffffffffd958 =
                 (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_ffffffffffffd8e0,
                            (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *(int *)&(in_stack_ffffffffffffd958->
                     super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                     _M_impl.super__Deque_impl_data._M_map = in_stack_ffffffffffffd954;
          }
          else {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = 1;
          }
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          pvVar17 = (void *)std::ostream::operator<<(local_1560,(*ppAVar22)->uniqueSupport);
          std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
          std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                    (local_1cb8);
          local_1d68._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),
                          (key_type *)0x227e0f);
          local_1d70._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
          bVar1 = std::operator!=(&local_1d68,&local_1d70);
          if (bVar1) {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            iVar5 = *pmVar21 + 1;
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = iVar5;
          }
          else {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = 1;
          }
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          pvVar17 = (void *)std::ostream::operator<<(local_19e0,(*ppAVar22)->support);
          std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_1bcc = local_1bcc + 1;
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          if (((double)(*ppAVar22)->uniqueSupport == local_580) &&
             (!NAN((double)(*ppAVar22)->uniqueSupport) && !NAN(local_580))) {
            local_1bd4 = local_1bd4 + 1;
          }
          std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                    (local_1cb8);
          local_1d38._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),
                          (key_type *)0x22797e);
          local_1d40._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
          bVar1 = std::operator!=(&local_1d38,&local_1d40);
          if (bVar1) {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            iVar5 = *pmVar21;
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = iVar5 + 1;
          }
          else {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = 1;
          }
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          pvVar17 = (void *)std::ostream::operator<<(local_1320,(*ppAVar22)->uniqueSupport);
          std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
          std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator*
                    (local_1cb8);
          local_1d48._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898),
                          (key_type *)0x227af0);
          local_1d50._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
          bVar1 = std::operator!=(&local_1d48,&local_1d50);
          if (bVar1) {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            iVar5 = *pmVar21;
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = iVar5 + 1;
          }
          else {
            std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
            operator*(local_1cb8);
            pmVar21 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_ffffffffffffd8e0,
                                 (key_type *)in_stack_ffffffffffffd8d8._M_pred._M_ptr);
            *pmVar21 = 1;
          }
          ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                     ::operator*(local_1cb8);
          pvVar17 = (void *)std::ostream::operator<<(local_17a0,(*ppAVar22)->support);
          std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
        }
        local_1bd0 = local_1bd0 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd8b0);
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                   in_stack_ffffffffffffd8a8,(int)((ulong)in_stack_ffffffffffffd8a0 >> 0x20));
      }
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      if ((local_4f2 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
        std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
        psVar30 = local_1db0;
        pcVar12 = (char *)std::__cxx11::string::c_str();
        remove(pcVar12);
        std::__cxx11::string::~string(psVar30);
        std::__cxx11::string::~string(local_1dd0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
        std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
        psVar30 = local_1df0;
        pcVar12 = (char *)std::__cxx11::string::c_str();
        remove(pcVar12);
        std::__cxx11::string::~string(psVar30);
        std::__cxx11::string::~string(local_1e10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
        std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
        psVar30 = local_1e30;
        pcVar12 = (char *)std::__cxx11::string::c_str();
        remove(pcVar12);
        std::__cxx11::string::~string(psVar30);
        std::__cxx11::string::~string(local_1e50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
        std::operator+(&in_stack_ffffffffffffd8a8->first,(char *)in_stack_ffffffffffffd8a0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        remove(pcVar12);
        std::__cxx11::string::~string(local_1e70);
        std::__cxx11::string::~string(local_1e90);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x228248);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x228255);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x228262);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x22826f);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)0x22827c);
      std::ofstream::~ofstream(local_19e0);
      std::ofstream::~ofstream(local_17a0);
      std::ofstream::~ofstream(local_1560);
      std::ofstream::~ofstream(local_1320);
    }
    printReads((ostream *)in_stack_ffffffffffffdc30,
               (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_ffffffffffffdc28,iVar5);
    if ((local_4cb & 1) != 0) {
      std::__cxx11::string::string(local_1eb0,local_180);
      printBAM((string *)filename,
               (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               CONCAT17(bVar4,in_stack_ffffffffffffdcb8),(SamHeader *)header_00,
               (RefVector *)references_00,(double)uniqueSupportFilter_00);
      std::__cxx11::string::~string(local_1eb0);
      if ((local_4f2 & 1) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd8c8._M_current,in_stack_ffffffffffffd8c0._M_current);
        std::ofstream::ofstream(local_20b0,local_20d0,_S_out);
        std::__cxx11::string::~string(local_20d0);
        printConsistingReads
                  (in_stack_ffffffffffffd960,in_stack_ffffffffffffd958,
                   (double)CONCAT44(in_stack_ffffffffffffd954,in_stack_ffffffffffffd950));
        std::ofstream::~ofstream(local_20b0);
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"final: ");
    sVar18 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size
                       ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x2284cb);
    pvVar17 = (void *)std::ostream::operator<<(poVar6,sVar18);
    std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
    local_20d8 = local_be8;
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    while (bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffd8a0,
                                   (_Self *)CONCAT44(in_stack_ffffffffffffd89c,
                                                     in_stack_ffffffffffffd898)), bVar1) {
      ppAVar22 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                 operator*(&local_20f8);
      pAVar29 = *ppAVar22;
      if (pAVar29 != (AlignmentRecord *)0x0) {
        AlignmentRecord::~AlignmentRecord(in_stack_ffffffffffffd8a0);
        operator_delete(pAVar29);
      }
      std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                ((_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                 in_stack_ffffffffffffd8a0);
    }
    if (local_be8 != (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x0) {
      pdVar15 = local_be8;
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~deque
                ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)poVar6);
      operator_delete(pdVar15);
    }
    if ((local_cd0 != (long *)0x0) && (std::ofstream::close(), local_cd0 != (long *)0x0)) {
      (**(code **)(*local_cd0 + 8))();
    }
    if ((local_c30 != (long *)0x0) && (local_c30 != (long *)0x0)) {
      (**(code **)(*local_c30 + 8))();
    }
    if ((local_cd8 != (long *)0x0) && (local_cd8 != (long *)0x0)) {
      (**(code **)(*local_cd8 + 8))();
    }
    if ((local_d28 != (long *)0x0) && (local_d28 != (long *)0x0)) {
      (**(code **)(*local_d28 + 8))();
    }
    if ((local_d30 != (CLEVER *)0x0) &&
       (in_stack_ffffffffffffd8b0 = local_d30, local_d30 != (CLEVER *)0x0)) {
      (*(code *)((((_Vector_impl *)&(local_d30->super_CliqueFinder)._vptr_CliqueFinder)->
                 super__Vector_impl_data)._M_start)->_M_string_length)();
    }
    std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3);
    std::ostream::operator<<(&std::cout,std::fixed);
    cVar23 = clock();
    lVar11 = cVar23 - local_a28;
    poVar6 = std::operator<<((ostream *)&std::cout,"time: ");
    this_00 = (CliqueCollector *)std::ostream::operator<<(poVar6,(double)lVar11 / 1000000.0);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_748 = 1;
    std::ofstream::~ofstream(local_1100);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x228777);
    CliqueCollector::~CliqueCollector(this_00);
  }
  else {
    local_cc0 = -1.0;
    local_cc8 = -1.0;
    bVar1 = read_mean_and_sd(psVar7,(double *)pmVar9,
                             (double *)CONCAT17(bVar3,in_stack_ffffffffffffdce8));
    if (bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Null distribution: mean ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_cc0);
      poVar6 = std::operator<<(poVar6,", sd ");
      pvVar17 = (void *)std::ostream::operator<<(poVar6,local_cc8);
      std::ostream::operator<<(pvVar17,std::endl<char,std::char_traits<char>>);
      pvVar17 = operator_new(0x30);
      GaussianEdgeCalculator::GaussianEdgeCalculator
                ((GaussianEdgeCalculator *)in_stack_ffffffffffffd930,in_stack_ffffffffffffd928,
                 (double)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                 (double)in_stack_ffffffffffffd918);
      local_c38 = pvVar17;
      goto LAB_0022638c;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error reading \"");
    poVar6 = std::operator<<(poVar6,local_2a8);
    poVar6 = std::operator<<(poVar6,"\".");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_748 = 1;
  }
  std::
  unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
                 *)in_stack_ffffffffffffd8b0);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
             in_stack_ffffffffffffd8b0);
  BamTools::SamHeader::~SamHeader(local_ba0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd8b0);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)0x2287f0);
LAB_00228838:
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)0x228845);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)0x228852);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_138);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
          *)0x2288c7);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
    cout<<"in main"<<endl;
    map<std::string, docopt::value> args
        = docopt::docopt(USAGE,
                         { argv + 1, argv + argc },
                         false);
    for(auto elem : args)
    {
    cout << elem.first << " " << elem.second << "\n";
    }

    // PARAMETERS
    string bamfile = args["<bamfile>"].asString();
    string outfile = "chromatypes.fasta";
    if (args["<output>"]) outfile = args["<output>"].asString();
    double edge_quasi_cutoff_cliques = 0.99; //stod(args["--edge_quasi_cutoff_cliques"].asString());
    double edge_quasi_cutoff_single = 0.95; //stod(args["--edge_quasi_cutoff_single"].asString());
    double edge_quasi_cutoff_mixed = 0.97; //stod(args["--edge_quasi_cutoff_mixed"].asString());
    double Q = 0.9;//stod(args["--random_overlap_quality"].asString());
    double overlap_cliques = 0.9; //stod(args["--min_overlap_cliques"].asString());
    double overlap_single = 0.6;//stod(args["--min_overlap_single"].asString());
    bool frameshift_merge; // args["--frame_shift_merge"].asBool();
    string allel_frequencies_path = "";
    if (args["--allel_frequencies"]) allel_frequencies_path = args["--allel_frequencies"].asString();
    string mean_and_sd_filename = "";
    if (args["--mean_and_sd_filename"]) mean_and_sd_filename = args["--mean_and_sd_filename"].asString();
    string indel_edge_cutoff;
    double indel_edge_sig_level = 0.2; //stod(args["--indel_edge_sig_level"].asString());
    string indel_output_file = "";
    if (args["--call_indels"]) indel_output_file = args["--call_indels"].asString();
    int iterations = stoi(args["--iterations"].asString());
    double filter = 0.0;// stod(args["--filter"].asString());
    double significance = 3.0; //stod(args["--significance"].asString());
    bool filter_singletons = args["--no_singletons"].asBool();
    string logfile = "";
    if (args["--log"]) logfile = args["--log"].asString();
    int doc_haplotypes = 0;
    if (args["--doc_haplotypes"]) doc_haplotypes = stoi(args["--doc_haplotypes"].asString());
    bool noProb0 = false; //args["--noProb0"].asBool();
    //-ot CHAR --output_type=CHAR
    bool bam = args["--bam"].asBool();
    bool analysisFiles = args["--analysisFiles"].asBool();
    bool nome = args["--nome"].asBool();
    double nomeParam = stod(args["--nomeParam"].asString());
    double uniqueSupportFilter = stod(args["--uniqueSupportFilter"].asString());
    double minOverlap = stod(args["--minOverlap"].asString());
    string reference_path;
    if (args["--ref"]) reference_path = args["--ref"].asString();

    //Read switch rates for both forward and reverse strand
    std::unordered_map<int, double> switchRateFS = readSwitchRateFile(args["--FS"].asString());
    std::unordered_map<int, double> switchRateRS = readSwitchRateFile(args["--RS"].asString());

    // END PARAMETERS

    bool call_indels = indel_output_file.size() > 0;
    if (call_indels && (mean_and_sd_filename.size() == 0)) {
        //cout<<"s1: "<<s1<<endl;
        //cout<<"s2: "<<s2<<endl;
        cerr << "Error: when using option -I, option -M must also be given." << endl;
        return 1;
    }

    //read allel frequency distributions
    std::unordered_map<int, double> simpson_map;
    unsigned int maxPosition2 = 0;
    //cerr << "PARSE PRIOR";
    cerr.flush();
    if (allel_frequencies_path.size() > 0) {
        ifstream ia(allel_frequencies_path.c_str());
        string ia_line;
        while (getline(ia, ia_line)) {
            std::vector<std::string> words;
            trim_right(ia_line);
            boost::split(words, ia_line, boost::is_any_of("\t"), boost::token_compress_on);

            std::vector<std::string> insertion_words;
            boost::split(insertion_words, words[0], boost::is_any_of("\\."), boost::token_compress_on);
            if (insertion_words.size() > 1) {
            } else {
                simpson_map[atoi(words[0].c_str())] = std::log10(pow(atof(words[1].c_str()),2)+pow(atof(words[2].c_str()),2)+pow(atof(words[3].c_str()),2)+pow(atof(words[4].c_str()),2));
                maxPosition2=atoi(words[0].c_str());
                //cerr << simpson_map[atoi(words[0].c_str())] << endl;
            }
        }
        ia.close();
    }
    //cout << "PARSE PRIOR: done" << endl;


    clock_t clock_start = clock();
    vector<string> originalReadNames;
    unsigned int maxPosition1;
    BamTools::SamHeader header;
    BamTools::RefVector references;
    deque<AlignmentRecord*>* reads = readBamFile(bamfile, originalReadNames,maxPosition1,header,references,reference_path);
    EdgeCalculator* edge_calculator = nullptr;
    EdgeCalculator* indel_edge_calculator = nullptr;
    unique_ptr<vector<mean_and_stddev_t> > readgroup_params(nullptr);
    maxPosition1 = (maxPosition1>maxPosition2) ? maxPosition1 : maxPosition2;

    if(nome){
        edge_calculator = new NoMeEdgeCalculator(nomeParam , switchRateFS , switchRateRS);
    }else{
        edge_calculator = new NewEdgeCalculator(Q, edge_quasi_cutoff_cliques, overlap_cliques, frameshift_merge, simpson_map, edge_quasi_cutoff_single, overlap_single, edge_quasi_cutoff_mixed, maxPosition1, noProb0);
    }
    if (call_indels) {
        double insert_mean = -1.0;
        double insert_stddev = -1.0;
        if (!read_mean_and_sd(mean_and_sd_filename, &insert_mean, &insert_stddev)) {
            cerr << "Error reading \"" << mean_and_sd_filename << "\"." << endl;
            return 1;
        }
        cerr << "Null distribution: mean " << insert_mean << ", sd " <<  insert_stddev << endl;
        indel_edge_calculator = new GaussianEdgeCalculator(indel_edge_sig_level,insert_mean,insert_stddev);
    }
    std::ofstream* indel_os = nullptr;
    if (call_indels) {
        indel_os = new ofstream(indel_output_file.c_str());
    }
    LogWriter* lw = nullptr;
    if (logfile != "") lw = new LogWriter(logfile);

    CliqueCollector collector(lw);
    CliqueFinder* clique_finder;

//    if (args["bronkerbosch"].asBool()) {
//        clique_finder = new BronKerbosch(*edge_calculator, collector, lw);
//    } else {
//        clique_finder = new CLEVER(*edge_calculator, collector, lw);
//    }

    clique_finder = new CLEVER(*edge_calculator, collector, lw);
    if (indel_edge_calculator != 0) {
        clique_finder->setSecondEdgeCalculator(indel_edge_calculator);
    }
    ofstream* reads_ofstream = 0;




//    cout<<"befor main loop"<<endl;
    // Main loop
    int ct = 0;
    double stdev = 1.0;
    auto filter_fn = [&](unique_ptr<AlignmentRecord>& read, int size) {

        return (ct == 1 and filter_singletons and read->getReadCount() <= 1) or (ct > 1 and significance != 0.0 and read->getProbability() < 1.0 / size - significance*stdev);
    };
    int edgecounter = 0;
    int nonEdgeCounter = 0;

    cout << "start: " << originalReadNames.size();
    int prevReadsSize = 0;
    int numAllowedGCPos = minOverlap;
    std::map<string,int> appearanceMap;
    while (ct != iterations) {
        if(appearanceMap.size()!=0){
            appearanceMap.clear();
        }
        clique_finder->initialize(&appearanceMap);

        if (lw != nullptr) lw->initialize();
        int size = reads->size();
        prevReadsSize = reads->size();


        while(not reads->empty()) {

            assert(reads->front() != nullptr);

            unique_ptr<AlignmentRecord> al_ptr(reads->front());

            reads->pop_front();
            if (filter_fn(al_ptr,size)) continue;
//            if(ct>0){
//                cout<<al_ptr->getName()<<endl;
//            }
            clique_finder->addAlignment(al_ptr,edgecounter,nonEdgeCounter,numAllowedGCPos,ct);

            //cout << "addAlignment " << ct << endl;

        }
        if(numAllowedGCPos>2){
            numAllowedGCPos--;
        }

        cout << "\tedges: " << edgecounter;
        cout << "\tnonEdges: " << nonEdgeCounter<<endl;


        delete reads;

        clique_finder->finish();
        reads = collector.finish();
        if (lw != nullptr) lw->finish();

        stdev = setProbabilities(*reads);
        if (clique_finder->hasConverged()) break;
        cout << ct++ << ": " << reads->size();
        edgecounter = 0;
        nonEdgeCounter = 0;
    }

    // Filter superreads according to read probability
    if (filter > 0.0) {
        auto filter_fn = [&](AlignmentRecord* al) { return al->getProbability() < filter;};
        auto new_end_it = std::remove_if(reads->begin(), reads->end(), filter_fn);
        for (auto it = new_end_it; it != reads->end(); it++) {
            delete *it;
            *it = nullptr;
        }
        reads->erase(new_end_it, reads->end());
    }
    ofstream os(outfile + ".fasta", std::ofstream::out);
    setProbabilities(*reads);
    //Filter superreads according to unique support information
    if(uniqueSupportFilter > -1){
        ofstream osUniqueError(outfile + "UniqueError" + ".txt",std::ofstream::out);
        ofstream osUniqueTrue(outfile + "UniqueTrue" + ".txt",std::ofstream::out);
        ofstream osSupportError(outfile + "SupportError" + ".txt",std::ofstream::out);
        ofstream osSupportTrue(outfile + "SupportTrue" + ".txt",std::ofstream::out);
        std::map<string,int> readCountMap;
        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    string token = s;
                    token.erase(token.begin(), std::find_if(token.begin(), token.end(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))));
                    token.erase(std::find_if(token.rbegin(), token.rend(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))).base(), token.end());
                    if(readCountMap.find(token)!=readCountMap.end()){
                        readCountMap.operator[](token) = readCountMap.operator[](token) + 1;
                    }else{
                        readCountMap.operator[](token) = 1;
                    }
                }
            }
        }


        int errorCount = 0;
        int totalCount = 0;
        int errorWithNoUnique = 0;
        int trueWithNoUnique = 0;

        std::map<int,int> trueReadsSupportMap;
        std::map<int,int> trueReadsUniqueSupportMap;
        std::map<int,int> errorReadsSupportMap;
        std::map<int,int> errorReadsUniqueSupportMap;


        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            int chroma1 = 0;
            int chroma2 = 0;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    if(readCountMap[s]>1){
                        (*it)->support += 1;
                    }else if(readCountMap[s]==1){
                        (*it)->uniqueSupport += 1;
                        (*it)->support += 1;
                    }

                    if(s.find("chroma1")!=string::npos) chroma1++;
                    if(s.find("chroma2")!=string::npos) chroma2++;
                }
            }

            if(chroma1!=0 && chroma2!=0){
              errorCount++;
              if((*it)->uniqueSupport==uniqueSupportFilter)errorWithNoUnique++;
              if(errorReadsUniqueSupportMap.find((*it)->uniqueSupport)!=errorReadsUniqueSupportMap.end()){
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = errorReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
              }else{
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
              }
              osUniqueError<<(*it)->uniqueSupport<<endl;
              if(errorReadsSupportMap.find((*it)->support)!=errorReadsSupportMap.end()){
                  errorReadsSupportMap[(*it)->support] = errorReadsSupportMap[(*it)->support] + 1;
              }else{
                  errorReadsSupportMap[(*it)->support] = 1;
              }
              osSupportError<<(*it)->support<<endl;
            }else{
               if((*it)->uniqueSupport==uniqueSupportFilter)trueWithNoUnique++;
               if(trueReadsUniqueSupportMap.find((*it)->uniqueSupport)!=trueReadsUniqueSupportMap.end()){
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = trueReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
               }else{
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
               }
               osUniqueTrue<<(*it)->uniqueSupport<<endl;
               if(trueReadsSupportMap.find((*it)->support)!=trueReadsSupportMap.end()){
                   trueReadsSupportMap[(*it)->support] = trueReadsSupportMap[(*it)->support] + 1;
               }else{
                   trueReadsSupportMap[(*it)->support] = 1;
               }
               osSupportTrue<<(*it)->support<<endl;
            }
            totalCount++;
        }

        osUniqueError.close();
        osSupportError.close();
        osUniqueTrue.close();
        osSupportTrue.close();
        if(!analysisFiles){
            std::remove((outfile + "UniqueError" + ".txt").c_str());
            std::remove((outfile + "UniqueTrue" + ".txt").c_str());
            std::remove((outfile + "SupportError" + ".txt").c_str());
            std::remove((outfile + "SupportTrue" + ".txt").c_str());
        }
    }

    printReads(os, *reads, doc_haplotypes);

    if (bam){
        //cout<<outfile+".bam"<<endl;
//        ofstream os2(outfile + ".bam",std::ofstream::out);
        printBAM(outfile,*reads,header,references,uniqueSupportFilter);
        if(analysisFiles){
            ofstream os3(outfile + "Reads.txt",std::ofstream::out);
            printConsistingReads(os3, *reads,uniqueSupportFilter);
        }
    }


    cout << "final: " << reads->size() << endl;

    for (auto&& r : *reads) {

        delete r;
    }

    delete reads;

    if (indel_os != nullptr) {
        indel_os->close();
        delete indel_os;
    }
    if (edge_calculator != nullptr) delete edge_calculator;
    if (lw != nullptr) delete lw;
    if (clique_finder != nullptr) delete clique_finder;
    if (reads_ofstream != nullptr) {
        delete reads_ofstream;
    }
    cout.precision(3);
    cout << std::fixed;
    double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
    cout << "time: " <<  cpu_time << endl;
    return 0;
}